

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkStartFromNoLatches(Abc_Ntk_t *pNtk,Abc_NtkType_t Type,Abc_NtkFunc_t Func)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  Vec_Int_t *pVVar7;
  int *__dest;
  size_t __size;
  long lVar8;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pNtk_00 = (Abc_Ntk_t *)0x0;
  }
  else {
    if (Type == ABC_NTK_NETLIST) {
      __assert_fail("Type != ABC_NTK_NETLIST",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                    ,0x106,
                    "Abc_Ntk_t *Abc_NtkStartFromNoLatches(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t)"
                   );
    }
    pNtk_00 = Abc_NtkAlloc(Type,Func,1);
    iVar1 = pNtk->nBarBufs;
    pNtk_00->nConstrs = pNtk->nConstrs;
    pNtk_00->nBarBufs = iVar1;
    pcVar3 = Extra_UtilStrsav(pNtk->pName);
    pNtk_00->pName = pcVar3;
    pcVar3 = Extra_UtilStrsav(pNtk->pSpec);
    pNtk_00->pSpec = pcVar3;
    Abc_NtkCleanCopy(pNtk);
    if ((pNtk->ntkType == ABC_NTK_STRASH) && (pNtk_00->ntkType == ABC_NTK_STRASH)) {
      pAVar4 = Abc_AigConst1(pNtk_00);
      pAVar5 = Abc_AigConst1(pNtk);
      (pAVar5->field_6).pCopy = pAVar4;
    }
    pVVar6 = pNtk->vPis;
    if (0 < pVVar6->nSize) {
      lVar8 = 0;
      do {
        Abc_NtkDupObj(pNtk_00,(Abc_Obj_t *)pVVar6->pArray[lVar8],1);
        lVar8 = lVar8 + 1;
        pVVar6 = pNtk->vPis;
      } while (lVar8 < pVVar6->nSize);
    }
    pVVar6 = pNtk->vPos;
    if (0 < pVVar6->nSize) {
      lVar8 = 0;
      do {
        Abc_NtkDupObj(pNtk_00,(Abc_Obj_t *)pVVar6->pArray[lVar8],1);
        lVar8 = lVar8 + 1;
        pVVar6 = pNtk->vPos;
      } while (lVar8 < pVVar6->nSize);
    }
    pVVar6 = pNtk->vBoxes;
    if (0 < pVVar6->nSize) {
      lVar8 = 0;
      do {
        if ((*(uint *)&((Abc_Obj_t *)pVVar6->pArray[lVar8])->field_0x14 & 0xf) != 8) {
          Abc_NtkDupBox(pNtk_00,(Abc_Obj_t *)pVVar6->pArray[lVar8],1);
          pVVar6 = pNtk->vBoxes;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < pVVar6->nSize);
    }
    pVVar2 = pNtk->vObjPerm;
    if (pVVar2 != (Vec_Int_t *)0x0) {
      pVVar7 = (Vec_Int_t *)malloc(0x10);
      iVar1 = pVVar2->nSize;
      pVVar7->nSize = iVar1;
      pVVar7->nCap = iVar1;
      if ((long)iVar1 == 0) {
        __size = 0;
        __dest = (int *)0x0;
      }
      else {
        __size = (long)iVar1 << 2;
        __dest = (int *)malloc(__size);
      }
      pVVar7->pArray = __dest;
      memcpy(__dest,pVVar2->pArray,__size);
      pNtk_00->vObjPerm = pVVar7;
    }
    pNtk_00->AndGateDelay = pNtk->AndGateDelay;
    Abc_ManTimeDup(pNtk,pNtk_00);
    if (pNtk->vPis->nSize != pNtk_00->vPis->nSize) {
      __assert_fail("Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                    ,0x125,
                    "Abc_Ntk_t *Abc_NtkStartFromNoLatches(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t)"
                   );
    }
    if (pNtk->vPos->nSize != pNtk_00->vPos->nSize) {
      __assert_fail("Abc_NtkPoNum(pNtk) == Abc_NtkPoNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                    ,0x126,
                    "Abc_Ntk_t *Abc_NtkStartFromNoLatches(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t)"
                   );
    }
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkStartFromNoLatches( Abc_Ntk_t * pNtk, Abc_NtkType_t Type, Abc_NtkFunc_t Func )
{
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj;
    int i;
    if ( pNtk == NULL )
        return NULL;
    assert( Type != ABC_NTK_NETLIST );
    // start the network
    pNtkNew = Abc_NtkAlloc( Type, Func, 1 );
    pNtkNew->nConstrs   = pNtk->nConstrs;
    pNtkNew->nBarBufs   = pNtk->nBarBufs;
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // map the constant nodes
    if ( Abc_NtkIsStrash(pNtk) && Abc_NtkIsStrash(pNtkNew) )
        Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);
    // clone CIs/CIs/boxes
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 );
    Abc_NtkForEachBox( pNtk, pObj, i )
    {
        if ( Abc_ObjIsLatch(pObj) )
            continue;
        Abc_NtkDupBox(pNtkNew, pObj, 1);
    }
    if ( pNtk->vObjPerm )
        pNtkNew->vObjPerm = Vec_IntDup( pNtk->vObjPerm );
    pNtkNew->AndGateDelay = pNtk->AndGateDelay;
    // transfer the names
//    Abc_NtkTrasferNamesNoLatches( pNtk, pNtkNew );
    Abc_ManTimeDup( pNtk, pNtkNew );
    // check that the CI/CO/latches are copied correctly
    assert( Abc_NtkPiNum(pNtk) == Abc_NtkPiNum(pNtkNew) );
    assert( Abc_NtkPoNum(pNtk) == Abc_NtkPoNum(pNtkNew) );
    return pNtkNew;
}